

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::RenameASTDeclarations::operator()(RenameASTDeclarations *this,ClassDecl *node)

{
  bool bVar1;
  element_type *node_00;
  element_type *node_01;
  element_type *peVar2;
  shared_ptr<mocker::ast::ASTNode> local_e0;
  shared_ptr<mocker::ast::Declaration> local_d0;
  reference local_c0;
  shared_ptr<mocker::ast::Declaration> *member_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
  *__range2_2;
  shared_ptr<mocker::ast::VarDecl> p_1;
  shared_ptr<mocker::ast::Declaration> *member_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
  *__range2_1;
  vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  memberVars;
  undefined1 local_48 [8];
  shared_ptr<mocker::ast::FuncDecl> p;
  shared_ptr<mocker::ast::Declaration> *member;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
  *__range2;
  ClassDecl *node_local;
  RenameASTDeclarations *this_local;
  
  __end2 = std::
           vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
           ::begin(&node->members);
  member = (shared_ptr<mocker::ast::Declaration> *)
           std::
           vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
           ::end(&node->members);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
                                     *)&member), bVar1) {
    p.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
         ::operator*(&__end2);
    std::dynamic_pointer_cast<mocker::ast::FuncDecl,mocker::ast::Declaration>
              ((shared_ptr<mocker::ast::Declaration> *)local_48);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
    if (bVar1) {
      node_00 = std::
                __shared_ptr_access<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
      peVar2 = std::
               __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&node->identifier);
      renameMemberFunc(this,node_00,&peVar2->val);
    }
    std::shared_ptr<mocker::ast::FuncDecl>::~shared_ptr
              ((shared_ptr<mocker::ast::FuncDecl> *)local_48);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  ::vector((vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
            *)&__range2_1);
  __end2_1 = std::
             vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
             ::begin(&node->members);
  member_1 = (shared_ptr<mocker::ast::Declaration> *)
             std::
             vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
             ::end(&node->members);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
                             *)&member_1), bVar1) {
    p_1.super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
         ::operator*(&__end2_1);
    std::dynamic_pointer_cast<mocker::ast::VarDecl,mocker::ast::Declaration>
              ((shared_ptr<mocker::ast::Declaration> *)&__range2_2);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range2_2);
    if (bVar1) {
      node_01 = std::
                __shared_ptr_access<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&__range2_2);
      peVar2 = std::
               __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&node->identifier);
      renameMemberVar(this,node_01,&peVar2->val);
    }
    std::shared_ptr<mocker::ast::VarDecl>::~shared_ptr
              ((shared_ptr<mocker::ast::VarDecl> *)&__range2_2);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::
             vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
             ::begin(&node->members);
  member_2 = (shared_ptr<mocker::ast::Declaration> *)
             std::
             vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
             ::end(&node->members);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
                             *)&member_2), bVar1) {
    local_c0 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
               ::operator*(&__end2_2);
    std::dynamic_pointer_cast<mocker::ast::VarDecl,mocker::ast::Declaration>(&local_d0);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_d0);
    std::shared_ptr<mocker::ast::VarDecl>::~shared_ptr
              ((shared_ptr<mocker::ast::VarDecl> *)&local_d0);
    if (!bVar1) {
      std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Declaration,void>
                (&local_e0,local_c0);
      visit(this,&local_e0);
      std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_e0);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::ast::Declaration>_*,_std::vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>_>
    ::operator++(&__end2_2);
  }
  std::
  vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  ::~vector((vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
             *)&__range2_1);
  return;
}

Assistant:

void operator()(ast::ClassDecl &node) const override {
    for (auto &member : node.members)
      if (auto p = std::dynamic_pointer_cast<ast::FuncDecl>(member))
        renameMemberFunc(*p, node.identifier->val);

    std::vector<std::shared_ptr<ast::VarDecl>> memberVars;
    for (auto &member : node.members)
      if (auto p = std::dynamic_pointer_cast<ast::VarDecl>(member))
        renameMemberVar(*p, node.identifier->val);

    for (auto &member : node.members) {
      if (std::dynamic_pointer_cast<ast::VarDecl>(member))
        continue;
      visit(member);
    }
  }